

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<Tracepoint::Field>::relocate
          (QArrayDataPointer<Tracepoint::Field> *this,qsizetype offset,Field **data)

{
  Field *d_first;
  Field *pFVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Tracepoint::Field,long_long>(this->ptr,this->size,d_first);
  if (data != (Field **)0x0) {
    pFVar1 = *data;
    if ((this->ptr <= pFVar1) && (pFVar1 < this->ptr + this->size)) {
      *data = pFVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }